

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadContext.cpp
# Opt level: O1

PropertyGuardEntry * __thiscall
ThreadContext::EnsurePropertyGuardEntry
          (ThreadContext *this,PropertyRecord *propertyRecord,bool *foundExistingEntry)

{
  AllocatorType *allocator;
  bool bVar1;
  RecyclableData *pRVar2;
  Recycler *alloc;
  undefined8 *puVar3;
  RecyclerWeakReference<const_Js::PropertyRecord> *weakRef;
  undefined1 local_60 [8];
  TrackAllocData data;
  PropertyGuardEntry *entry;
  
  pRVar2 = Memory::RecyclerRootPtr<ThreadContext::RecyclableData>::operator->(&this->recyclableData)
  ;
  data.line = 0;
  data._36_4_ = 0;
  bVar1 = JsUtil::
          WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
          ::TryGetValue(&pRVar2->propertyGuards,propertyRecord,(PropertyGuardEntry **)&data.line);
  *foundExistingEntry = bVar1;
  if (!bVar1) {
    local_60 = (undefined1  [8])&PropertyGuardEntry::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.plusSize = 0xffffffffffffffff;
    data.count = (size_t)anon_var_dwarf_3154530;
    data.filename._0_4_ = 0xdaa;
    alloc = Memory::Recycler::TrackAllocInfo(this->recycler,(TrackAllocData *)local_60);
    puVar3 = (undefined8 *)new<Memory::Recycler>(0x48,alloc,0x38bbb2);
    allocator = this->recycler;
    *puVar3 = 0;
    JsUtil::
    BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
    ::BaseDictionary((BaseDictionary<Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::RecyclerWeakReference<Js::PropertyGuard>_*,_Memory::Recycler,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleHashedEntry,_JsUtil::NoResizeLock>
                      *)(puVar3 + 1),allocator,0);
    puVar3[8] = 0;
    data._32_8_ = puVar3;
    weakRef = CreatePropertyRecordWeakRef(this,propertyRecord);
    JsUtil::
    WeaklyReferencedKeyDictionary<const_Js::PropertyRecord,_ThreadContext::PropertyGuardEntry_*,_Js::PropertyRecordPointerComparer,_true>
    ::UncheckedInsert(&pRVar2->propertyGuards,weakRef,(PropertyGuardEntry *)data._32_8_);
  }
  return (PropertyGuardEntry *)data._32_8_;
}

Assistant:

ThreadContext::PropertyGuardEntry*
ThreadContext::EnsurePropertyGuardEntry(const Js::PropertyRecord* propertyRecord, bool& foundExistingEntry)
{
    PropertyGuardDictionary &guards = this->recyclableData->propertyGuards;
    PropertyGuardEntry* entry = nullptr;

    foundExistingEntry = guards.TryGetValue(propertyRecord, &entry);
    if (!foundExistingEntry)
    {
        entry = RecyclerNew(GetRecycler(), PropertyGuardEntry, GetRecycler());

        guards.UncheckedAdd(CreatePropertyRecordWeakRef(propertyRecord), entry);
    }

    return entry;
}